

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::EnumFirstLastMethod::checkArguments
          (EnumFirstLastMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  not_null<const_slang::ast::Type_*> *pnVar3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount(&this->super_SystemSubroutine,context,true,args,range,0,0)
  ;
  if (bVar2) {
    pnVar3 = &(*args->_M_ptr)->type;
  }
  else {
    pnVar3 = (not_null<const_slang::ast::Type_*> *)&pCVar1->errorType;
  }
  return pnVar3->ptr;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        return *args[0]->type;
    }